

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_ladd(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  Value VVar2;
  undefined8 local_50;
  Value value_1;
  ValueType VStack_2c;
  Value value_2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  Frame::popTopOfOperandStack(this_01);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VStack_2c = VVar1.type;
  if (VStack_2c != LONG) {
    __assert_fail("value_2.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x7b7,"void ExecutionEngine::i_ladd()");
  }
  local_50._4_4_ = VVar2.type;
  if (local_50._4_4_ == LONG) {
    value_1._0_8_ = VVar2.data;
    value_2._0_8_ = VVar1.data;
    local_50 = VVar2._0_8_;
    VVar1.data.object = (Object *)(value_1._0_8_ + value_2._0_8_);
    VVar1.printType = (undefined4)local_50;
    VVar1.type = local_50._4_4_;
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x7b8,"void ExecutionEngine::i_ladd()");
}

Assistant:

void ExecutionEngine::i_ladd() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack(); //padding
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::LONG);
	assert(value_1.type == ValueType::LONG);

	value_1.data.longValue = value_1.data.longValue + (value_2.data.longValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}